

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::verifyFloatSignedNorm<short>
               (GLint original_value,GLint positive_value,GLint negated_value)

{
  long lVar1;
  GLint negated_value_local;
  GLint positive_value_local;
  
  positive_value_local = positive_value;
  negated_value_local = negated_value;
  if (original_value == positive_value) {
    lVar1 = 0;
    while ((int)*(short *)((long)&negated_value_local + lVar1 * 2) +
           (int)*(short *)((long)&positive_value_local + lVar1 * 2) == 0) {
      lVar1 = lVar1 + 1;
      if (lVar1 != 1) {
        return lVar1 != 1;
      }
    }
  }
  return false;
}

Assistant:

static bool verifyFloatSignedNorm(GLint original_value, GLint positive_value, GLint negated_value)
	{
		if (original_value != positive_value)
		{
			return false;
		}

		static const GLuint n_elements = sizeof(GLint) / sizeof(T); /* 1, 2, 4 */

		const T* positive_elements = (T*)&positive_value;
		const T* negated_elements  = (T*)&negated_value;

		for (GLuint i = 0; i < n_elements; ++i)
		{
			const T positive_element = positive_elements[i];
			const T negated_element  = negated_elements[i];

			/* Compare data bits */
			if (positive_element != -negated_element)
			{
				return false;
			}
		}

		return true;
	}